

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O3

Point2f __thiscall pbrt::ZSobolSampler::Get2D(ZSobolSampler *this)

{
  uint32_t v;
  uint uVar1;
  uint64_t uVar2;
  ulong uVar3;
  uint *puVar4;
  uint uVar5;
  uint64_t uVar6;
  uint32_t v_00;
  uint32_t uVar7;
  long lVar8;
  bool bVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 in_ZMM0 [64];
  undefined1 in_XMM2 [16];
  OwenScrambler local_40;
  OwenScrambler local_3c;
  undefined1 local_38 [16];
  
  auVar11 = in_ZMM0._0_16_;
  uVar2 = GetSampleIndex(this);
  uVar3 = (ulong)(this->seed ^ this->dimension);
  this->dimension = this->dimension + 2;
  uVar3 = (uVar3 >> 0x1f ^ uVar3) * 0x7fb5d329728ea185;
  lVar8 = (uVar3 >> 0x1b ^ uVar3) * -0x7e25210b43d22bb3;
  local_3c.seed = (uint32_t)((ulong)lVar8 >> 0x20);
  local_40.seed = local_3c.seed >> 1 ^ (uint)lVar8;
  switch(this->randomizeStrategy) {
  case None:
    if (uVar2 == 0) {
      local_38 = ZEXT816(0) << 0x40;
      auVar11 = ZEXT816(0) << 0x40;
      goto LAB_001c1b94;
    }
    puVar4 = &SobolMatrices32;
    uVar1 = 0;
    uVar6 = uVar2;
    do {
      if ((uVar6 & 1) != 0) {
        uVar1 = uVar1 ^ *puVar4;
      }
      puVar4 = puVar4 + 1;
      bVar9 = 1 < uVar6;
      uVar6 = (long)uVar6 >> 1;
    } while (bVar9);
    auVar11 = vcvtusi2ss_avx512f(auVar11,uVar1);
    puVar4 = &DAT_007cd670;
    uVar1 = 0;
    do {
      if ((uVar2 & 1) != 0) {
        uVar1 = uVar1 ^ *puVar4;
      }
      puVar4 = puVar4 + 1;
      bVar9 = 1 < uVar2;
      uVar2 = (long)uVar2 >> 1;
    } while (bVar9);
    local_38 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                          ZEXT416((uint)(auVar11._0_4_ * 2.3283064e-10)));
    break;
  case CranleyPatterson:
    if (uVar2 == 0) {
      auVar11 = vcvtusi2ss_avx512f(auVar11,local_40.seed);
      fVar10 = auVar11._0_4_;
      auVar11 = SUB6416(ZEXT464(0x3f7fffff),0);
      uVar1 = 0;
    }
    else {
      puVar4 = &SobolMatrices32;
      uVar5 = 0;
      uVar6 = uVar2;
      do {
        if ((uVar6 & 1) != 0) {
          uVar5 = uVar5 ^ *puVar4;
        }
        puVar4 = puVar4 + 1;
        bVar9 = 1 < uVar6;
        uVar6 = (long)uVar6 >> 1;
      } while (bVar9);
      uVar1 = 0;
      auVar11 = vcvtusi2ss_avx512f(auVar11,uVar5 + local_40.seed);
      fVar10 = auVar11._0_4_;
      puVar4 = &DAT_007cd670;
      do {
        if ((uVar2 & 1) != 0) {
          uVar1 = uVar1 ^ *puVar4;
        }
        puVar4 = puVar4 + 1;
        bVar9 = 1 < uVar2;
        uVar2 = (long)uVar2 >> 1;
      } while (bVar9);
      auVar11 = SUB6416(ZEXT464(0x3f7fffff),0);
    }
    local_38 = vminss_avx(auVar11,ZEXT416((uint)(fVar10 * 2.3283064e-10)));
    uVar1 = uVar1 + local_3c.seed;
    break;
  case PermuteDigits:
    if (uVar2 == 0) {
      auVar11 = vcvtusi2ss_avx512f(auVar11,local_40.seed);
      fVar10 = auVar11._0_4_;
      auVar11 = SUB6416(ZEXT464(0x3f7fffff),0);
      uVar1 = 0;
    }
    else {
      puVar4 = &SobolMatrices32;
      uVar5 = 0;
      uVar6 = uVar2;
      do {
        if ((uVar6 & 1) != 0) {
          uVar5 = uVar5 ^ *puVar4;
        }
        puVar4 = puVar4 + 1;
        bVar9 = 1 < uVar6;
        uVar6 = (long)uVar6 >> 1;
      } while (bVar9);
      uVar1 = 0;
      auVar11 = vcvtusi2ss_avx512f(auVar11,uVar5 ^ local_40.seed);
      fVar10 = auVar11._0_4_;
      puVar4 = &DAT_007cd670;
      do {
        if ((uVar2 & 1) != 0) {
          uVar1 = uVar1 ^ *puVar4;
        }
        puVar4 = puVar4 + 1;
        bVar9 = 1 < uVar2;
        uVar2 = (long)uVar2 >> 1;
      } while (bVar9);
      auVar11 = SUB6416(ZEXT464(0x3f7fffff),0);
    }
    local_38 = vminss_avx(auVar11,ZEXT416((uint)(fVar10 * 2.3283064e-10)));
    uVar1 = uVar1 ^ local_3c.seed;
    break;
  case FastOwen:
    if (uVar2 != 0) {
      do {
        bVar9 = 1 < uVar2;
        uVar2 = (long)uVar2 >> 1;
      } while (bVar9);
    }
    halt_baddata();
  default:
    uVar7 = 0;
    v_00 = 0;
    if (uVar2 != 0) {
      puVar4 = &SobolMatrices32;
      uVar7 = 0;
      uVar6 = uVar2;
      do {
        if ((uVar6 & 1) != 0) {
          uVar7 = uVar7 ^ *puVar4;
        }
        puVar4 = puVar4 + 1;
        bVar9 = 1 < uVar6;
        uVar6 = (long)uVar6 >> 1;
      } while (bVar9);
    }
    uVar7 = OwenScrambler::operator()(&local_40,uVar7);
    auVar11 = vcvtusi2ss_avx512f(auVar11,uVar7);
    if (uVar2 != 0) {
      puVar4 = &DAT_007cd670;
      v_00 = 0;
      do {
        if ((uVar2 & 1) != 0) {
          v_00 = v_00 ^ *puVar4;
        }
        puVar4 = puVar4 + 1;
        bVar9 = 1 < uVar2;
        uVar2 = (long)uVar2 >> 1;
      } while (bVar9);
    }
    local_38 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                          ZEXT416((uint)(auVar11._0_4_ * 2.3283064e-10)));
    uVar1 = OwenScrambler::operator()(&local_3c,v_00);
  }
  auVar11 = vcvtusi2ss_avx512f(in_XMM2,uVar1);
  auVar11 = ZEXT416((uint)(auVar11._0_4_ * 2.3283064e-10));
LAB_001c1b94:
  auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar11);
  auVar11 = vinsertps_avx(local_38,auVar11,0x10);
  return (Point2f)auVar11._0_8_;
}

Assistant:

PBRT_CPU_GPU
    Point2f Get2D() {
        uint64_t sampleIndex = GetSampleIndex();
        uint64_t bits = MixBits(dimension ^ seed);
        uint32_t sampleHash[2] = {uint32_t(bits), uint32_t(bits >> 32)};

        dimension += 2;

        if (randomizeStrategy == RandomizeStrategy::None)
            return {SobolSample(sampleIndex, 0, NoRandomizer()),
                    SobolSample(sampleIndex, 1, NoRandomizer())};
        else if (randomizeStrategy == RandomizeStrategy::CranleyPatterson)
            return {SobolSample(sampleIndex, 0, CranleyPattersonRotator(sampleHash[0])),
                    SobolSample(sampleIndex, 1, CranleyPattersonRotator(sampleHash[1]))};
        else if (randomizeStrategy == RandomizeStrategy::PermuteDigits)
            return {SobolSample(sampleIndex, 0, BinaryPermuteScrambler(sampleHash[0])),
                    SobolSample(sampleIndex, 1, BinaryPermuteScrambler(sampleHash[1]))};
        else if (randomizeStrategy == RandomizeStrategy::FastOwen)
            return {SobolSample(sampleIndex, 0, FastOwenScrambler(sampleHash[0])),
                    SobolSample(sampleIndex, 1, FastOwenScrambler(sampleHash[1]))};
        else
            return {SobolSample(sampleIndex, 0, OwenScrambler(sampleHash[0])),
                    SobolSample(sampleIndex, 1, OwenScrambler(sampleHash[1]))};
    }